

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
* __thiscall
pstore::json::details::string_matcher<pstore::json::null_output>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
           *__return_storage_ptr__,string_matcher<pstore::json::null_output> *this,
          parser<pstore::json::null_output> *parser,maybe<char,_void> *ch)

{
  state sVar1;
  uint hex;
  bool bVar2;
  uint8_t *puVar3;
  error_category *peVar4;
  char32_t *pcVar5;
  tuple<unsigned_int,_pstore::json::details::string_matcher<pstore::json::null_output>::state>
  *ptVar6;
  int line;
  undefined8 uVar7;
  ulong uVar8;
  char *str;
  error_code err;
  error_code err_00;
  error_code err_01;
  maybe<char32_t,_void> code_point;
  tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_pstore::json::error_code>
  escape_resl;
  maybe<char32_t,_void> local_50;
  undefined1 local_48 [8];
  error_category *local_40;
  _Head_base<0UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state,_false>
  local_38;
  
  if (ch->valid_ == false) {
    peVar4 = get_error_category();
    err._M_cat = peVar4;
    err._0_8_ = 2;
    bVar2 = parser<pstore::json::null_output>::set_error(parser,err);
    if (bVar2) {
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
    }
    goto LAB_001628aa;
  }
  puVar3 = (uint8_t *)maybe<char,_void>::operator->(ch);
  utf::utf8_decoder::get(&local_50,&this->decoder_,*puVar3);
  if (local_50.valid_ != true) goto switchD_00162712_default;
  sVar1 = (this->super_matcher<pstore::json::null_output>).state_;
  switch(sVar1) {
  case done_state:
    line = 0x476;
    str = "false";
LAB_001628eb:
    assert_failed(str,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,line);
  case start_state:
    pcVar5 = maybe<char32_t,_void>::operator->(&local_50);
    if (*pcVar5 != L'\"') {
      local_40 = get_error_category();
      uVar8 = 8;
      goto LAB_0016288d;
    }
    if ((this->app_).high_surrogate_ != L'\0') {
      line = 0x44a;
      str = "!app_.has_high_surrogate ()";
      goto LAB_001628eb;
    }
    (this->super_matcher<pstore::json::null_output>).state_ = 3;
    break;
  case normal_char_state:
    pcVar5 = maybe<char32_t,_void>::operator->(&local_50);
    consume_normal_state
              ((tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_std::error_code>
                *)local_48,this,parser,*pcVar5,&this->app_);
    (this->super_matcher<pstore::json::null_output>).state_ = local_38._M_head_impl;
    uVar8 = (ulong)(uint)local_48._0_4_;
    goto LAB_0016288d;
  case escape_state:
    pcVar5 = maybe<char32_t,_void>::operator->(&local_50);
    consume_escape_state((string_matcher<pstore::json::null_output> *)local_48,*pcVar5,&this->app_);
    (this->super_matcher<pstore::json::null_output>).state_ = local_48._4_4_;
    local_40 = get_error_category();
    uVar8 = (ulong)(uint)local_48._0_4_;
LAB_0016288d:
    err_01._M_cat = local_40;
    err_01._0_8_ = uVar8;
    bVar2 = parser<pstore::json::null_output>::set_error(parser,err_01);
    if (bVar2) {
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
    }
    break;
  case hex1_state:
    this->hex_ = 0;
  case hex2_state:
  case hex3_state:
  case hex4_state:
    hex = this->hex_;
    pcVar5 = maybe<char32_t,_void>::operator->(&local_50);
    consume_hex_state((maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<pstore::json::null_output>::state>,_void>
                       *)local_48,hex,sVar1,*pcVar5);
    if (local_48[0] == false) {
      peVar4 = get_error_category();
      uVar7 = 10;
    }
    else {
      ptVar6 = maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<pstore::json::null_output>::state>,_void>
               ::operator->((maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<pstore::json::null_output>::state>,_void>
                             *)local_48);
      this->hex_ = (ptVar6->
                   super__Tuple_impl<0UL,_unsigned_int,_pstore::json::details::string_matcher<pstore::json::null_output>::state>
                   ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl;
      ptVar6 = maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<pstore::json::null_output>::state>,_void>
               ::operator->((maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<pstore::json::null_output>::state>,_void>
                             *)local_48);
      sVar1 = (ptVar6->
              super__Tuple_impl<0UL,_unsigned_int,_pstore::json::details::string_matcher<pstore::json::null_output>::state>
              ).
              super__Tuple_impl<1UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state>
              .
              super__Head_base<1UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state,_false>
              ._M_head_impl;
      (this->super_matcher<pstore::json::null_output>).state_ = sVar1;
      if ((sVar1 != normal_char_state) ||
         (bVar2 = appender::append16(&this->app_,(char16_t)this->hex_), bVar2)) break;
      peVar4 = get_error_category();
      uVar7 = 0xd;
    }
    err_00._M_cat = peVar4;
    err_00._0_8_ = uVar7;
    bVar2 = parser<pstore::json::null_output>::set_error(parser,err_00);
    if (bVar2) {
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
    }
  }
switchD_00162712_default:
LAB_001628aa:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
       = 0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
  _M_head_impl = (matcher<pstore::json::null_output> *)0x0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
       = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
          )0x1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
  _M_head_impl = (matcher<pstore::json::null_output> *)0x0;
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            string_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_close_quote);
                    return {nullptr, true};
                }

                if (maybe<char32_t> const code_point =
                        decoder_.get (static_cast<std::uint8_t> (*ch))) {
                    switch (this->get_state ()) {
                    // Matches the opening quote.
                    case start_state:
                        if (*code_point == '"') {
                            PSTORE_ASSERT (!app_.has_high_surrogate ());
                            this->set_state (normal_char_state);
                        } else {
                            this->set_error (parser, error_code::expected_token);
                        }
                        break;
                    case normal_char_state: {
                        auto const normal_resl =
                            string_matcher::consume_normal_state (parser, *code_point, app_);
                        this->set_state (std::get<0> (normal_resl));
                        this->set_error (parser, std::get<std::error_code> (normal_resl));
                    } break;

                    case escape_state: {
                        auto const escape_resl =
                            string_matcher::consume_escape_state (*code_point, app_);
                        this->set_state (std::get<0> (escape_resl));
                        this->set_error (parser, std::get<1> (escape_resl));
                    } break;

                    case hex1_state: hex_ = 0; PSTORE_FALLTHROUGH;
                    case hex2_state:
                    case hex3_state:
                    case hex4_state: {
                        maybe<std::tuple<unsigned, state>> const hex_resl =
                            string_matcher::consume_hex_state (
                                hex_, static_cast<state> (this->get_state ()), *code_point);
                        if (!hex_resl) {
                            this->set_error (parser, error_code::invalid_hex_char);
                            break;
                        }
                        hex_ = std::get<0> (*hex_resl);
                        state const next_state = std::get<1> (*hex_resl);
                        this->set_state (next_state);
                        // We're done with the hex characters and are switching back to the "normal"
                        // state. The means that we can add the accumulated code-point (in hex_) to
                        // the string.
                        if (next_state == normal_char_state) {
                            if (!app_.append16 (static_cast<char16_t> (hex_))) {
                                this->set_error (parser, error_code::bad_unicode_code_point);
                            }
                        }
                    } break;

                    case done_state: PSTORE_ASSERT (false); break;
                    }
                }
                return {nullptr, true};
            }